

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chunk.cpp
# Opt level: O0

bool __thiscall stream::chunk::operator==(chunk *this,chunk *o)

{
  bool local_11;
  chunk *o_local;
  chunk *this_local;
  
  local_11 = false;
  if ((((this->first_slice == o->first_slice) &&
       (local_11 = false, this->sort_offset == o->sort_offset)) &&
      (local_11 = false, this->size == o->size)) &&
     (local_11 = false, this->compression == o->compression)) {
    local_11 = this->encryption == o->encryption;
  }
  return local_11;
}

Assistant:

bool chunk::operator==(const chunk & o) const {
	return (first_slice == o.first_slice
	        && sort_offset == o.sort_offset
	        && size == o.size
	        && compression == o.compression
	        && encryption == o.encryption);
}